

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall wabt::SharedValidator::OnThrow(SharedValidator *this,Location *loc,Var *tag_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  TagType tag_type;
  TagType local_98;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0x8,loc);
  local_98.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Var::Var(&local_78,tag_var);
  RVar2 = CheckTagIndex(this,&local_78,&local_98);
  Var::~Var(&local_78);
  RVar3 = TypeChecker::OnThrow(&this->typechecker_,&local_98.params);
  if (local_98.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnThrow(const Location& loc, Var tag_var) {
  Result result = CheckInstr(Opcode::Throw, loc);
  TagType tag_type;
  result |= CheckTagIndex(tag_var, &tag_type);
  result |= typechecker_.OnThrow(tag_type.params);
  return result;
}